

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgConstructSurrogate.hpp
# Opt level: O2

void TasGrid::constructSurrogate<false,false>
               (ModelSignature *model,size_t max_num_points,size_t num_parallel_jobs,
               size_t max_samples_per_job,TasmanianSparseGrid *grid,double tolerance,
               TypeRefinement criteria,int output,vector<int,_std::allocator<int>_> *level_limits,
               string *checkpoint_filename)

{
  BaseCanonicalGrid *pBVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  char cVar3;
  runtime_error *this;
  TypeRefinement criteria_local;
  double tolerance_local;
  function<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&)> local_90;
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
  local_70;
  anon_class_32_4_7142f7b3 local_50;
  
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  criteria_local = criteria;
  tolerance_local = tolerance;
  if (pBVar1 != (BaseCanonicalGrid *)0x0) {
    cVar3 = (**(code **)(*(long *)pBVar1 + 0x20))();
    if (cVar3 != '\0') {
LAB_0010dece:
      pvVar2 = level_limits;
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
      ::function(&local_70,model);
      local_50.tolerance = &tolerance_local;
      local_50.criteria = &criteria_local;
      local_50.output = &output;
      local_50.level_limits = pvVar2;
      std::function<std::vector<double,std::allocator<double>>(TasGrid::TasmanianSparseGrid&)>::
      function<TasGrid::constructSurrogate<false,false>(std::function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&,unsigned_long)>,unsigned_long,unsigned_long,unsigned_long,TasGrid::TasmanianSparseGrid&,double,TasGrid::TypeRefinement,int,std::vector<int,std::allocator<int>>const&,std::__cxx11::string_const&)::_lambda(TasGrid::TasmanianSparseGrid&)_1_,void>
                ((function<std::vector<double,std::allocator<double>>(TasGrid::TasmanianSparseGrid&)>
                  *)&local_90,&local_50);
      constructCommon<false,false>
                (&local_70,max_num_points,num_parallel_jobs,max_samples_per_job,grid,&local_90,
                 checkpoint_filename);
      std::_Function_base::~_Function_base(&local_90.super__Function_base);
      std::_Function_base::~_Function_base(&local_70.super__Function_base);
      return;
    }
    pBVar1 = (grid->base)._M_t.
             super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
    if (pBVar1 != (BaseCanonicalGrid *)0x0) {
      cVar3 = (**(code **)(*(long *)pBVar1 + 0x28))();
      if (cVar3 != '\0') goto LAB_0010dece;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this,
             "ERROR: construction (with tolerance and criteria) called for a grid that is not local polynomial or wavelet."
            );
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void constructSurrogate(ModelSignature model,
                        size_t max_num_points, size_t num_parallel_jobs, size_t max_samples_per_job,
                        TasmanianSparseGrid &grid,
                        double tolerance, TypeRefinement criteria, int output = -1,
                        std::vector<int> const &level_limits = std::vector<int>(),
                        std::string const &checkpoint_filename = std::string()){
    if (!grid.isLocalPolynomial() && !grid.isWavelet()) throw std::runtime_error("ERROR: construction (with tolerance and criteria) called for a grid that is not local polynomial or wavelet.");
    constructCommon<parallel_construction, initial_guess>
                                          (model, max_num_points, num_parallel_jobs, max_samples_per_job, grid,
                                           [&](TasmanianSparseGrid &g)->std::vector<double>{
                                               return g.getCandidateConstructionPoints(tolerance, criteria, output, level_limits);
                                           }, checkpoint_filename);
}